

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

int test_auth_password(LIBSSH2_SESSION *session,int flags,char *username,char *password)

{
  int iVar1;
  size_t sVar2;
  char *__haystack;
  char *pcVar3;
  size_t sVar4;
  char *userauth_list;
  int rc;
  char *password_local;
  char *username_local;
  int flags_local;
  LIBSSH2_SESSION *session_local;
  
  sVar2 = strlen(username);
  __haystack = (char *)libssh2_userauth_list(session,username,sVar2 & 0xffffffff);
  if (__haystack == (char *)0x0) {
    print_last_session_error("libssh2_userauth_list");
    session_local._4_4_ = 1;
  }
  else {
    pcVar3 = strstr(__haystack,"password");
    if (pcVar3 == (char *)0x0) {
      fprintf(_stderr,"\'password\' was expected in userauth list: %s\n",__haystack);
      session_local._4_4_ = 1;
    }
    else {
      sVar2 = strlen(username);
      sVar4 = strlen(password);
      iVar1 = libssh2_userauth_password_ex
                        (session,username,sVar2 & 0xffffffff,password,sVar4 & 0xffffffff,0);
      if ((flags & 1U) == 0) {
        if (iVar1 != 0) {
          print_last_session_error("libssh2_userauth_password_ex");
          return 1;
        }
        iVar1 = libssh2_userauth_authenticated(session);
        if (iVar1 == 0) {
          fprintf(_stderr,
                  "Password auth appeared to succeed but libssh2_userauth_authenticated returned 0\n"
                 );
          return 1;
        }
      }
      else if (iVar1 == 0) {
        fprintf(_stderr,"Password auth succeeded with wrong password\n");
        return 1;
      }
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

int test_auth_password(LIBSSH2_SESSION *session, int flags,
                       const char *username,
                       const char *password)
{
    int rc;

    const char *userauth_list =
        libssh2_userauth_list(session, username,
                              (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "password")) {
        fprintf(stderr, "'password' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_password_ex(session, username,
                                      (unsigned int)strlen(username),
                                      password,
                                      (unsigned int)strlen(password),
                                      NULL);

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Password auth succeeded with wrong password\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error("libssh2_userauth_password_ex");
            return 1;
        }

        if(libssh2_userauth_authenticated(session) == 0) {
            fprintf(stderr, "Password auth appeared to succeed but "
                            "libssh2_userauth_authenticated returned 0\n");
            return 1;
        }
    }

    return 0;
}